

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_copynsort(int nbricks,int *blist,int **slist,int **sindex)

{
  int iVar1;
  int *__ptr;
  int *piVar2;
  int local_44;
  int tmp;
  int spos;
  int c2;
  int c1;
  int *itmp;
  int *stmp;
  int **sindex_local;
  int **slist_local;
  int *blist_local;
  int nbricks_local;
  
  piVar2 = (int *)malloc((long)nbricks << 2);
  *slist = piVar2;
  piVar2 = (int *)malloc((long)nbricks << 2);
  *sindex = piVar2;
  if ((*slist == (int *)0x0) || (*sindex == (int *)0x0)) {
    fprintf(_stderr,"** NCS: failed to alloc %d ints for sorting\n",(ulong)(uint)nbricks);
    if (*slist != (int *)0x0) {
      free(*slist);
    }
    if (*sindex != (int *)0x0) {
      free(*sindex);
    }
    blist_local._4_4_ = -1;
  }
  else {
    memcpy(*slist,blist,(long)nbricks << 2);
    for (spos = 0; spos < nbricks; spos = spos + 1) {
      (*sindex)[spos] = spos;
    }
    piVar2 = *slist;
    __ptr = *sindex;
    for (spos = 0; spos < nbricks + -1; spos = spos + 1) {
      local_44 = spos;
      tmp = spos;
      while (tmp = tmp + 1, tmp < nbricks) {
        if (piVar2[tmp] < piVar2[local_44]) {
          local_44 = tmp;
        }
      }
      if (local_44 != spos) {
        iVar1 = piVar2[spos];
        piVar2[spos] = piVar2[local_44];
        piVar2[local_44] = iVar1;
        iVar1 = __ptr[spos];
        __ptr[spos] = __ptr[local_44];
        __ptr[local_44] = iVar1;
      }
    }
    if (2 < g_opts.debug) {
      fprintf(_stderr,"+d sorted indexing list:\n");
      fprintf(_stderr,"  orig   : ");
      for (spos = 0; spos < nbricks; spos = spos + 1) {
        fprintf(_stderr,"  %d",(ulong)(uint)blist[spos]);
      }
      fprintf(_stderr,"\n  new    : ");
      for (spos = 0; spos < nbricks; spos = spos + 1) {
        fprintf(_stderr,"  %d",(ulong)(uint)piVar2[spos]);
      }
      fprintf(_stderr,"\n  indices: ");
      for (spos = 0; spos < nbricks; spos = spos + 1) {
        fprintf(_stderr,"  %d",(ulong)(uint)__ptr[spos]);
      }
      fputc(10,_stderr);
    }
    for (spos = 0; spos < nbricks + -1; spos = spos + 1) {
      if ((piVar2[spos + 1] < piVar2[spos]) || (blist[__ptr[spos]] != piVar2[spos])) {
        fprintf(_stderr,"** sorting screw-up, way to go, rick!\n");
        free(piVar2);
        free(__ptr);
        *slist = (int *)0x0;
        *sindex = (int *)0x0;
        return -1;
      }
    }
    if (2 < g_opts.debug) {
      fprintf(_stderr,"-d sorting is okay\n");
    }
    blist_local._4_4_ = 0;
  }
  return blist_local._4_4_;
}

Assistant:

static int nifti_copynsort(int nbricks, const int * blist, int ** slist,
                           int ** sindex)
{
   int * stmp, * itmp;   /* for ease of typing/reading */
   int   c1, c2, spos, tmp;

   *slist  = (int *)malloc(nbricks * sizeof(int));
   *sindex = (int *)malloc(nbricks * sizeof(int));

   if( !*slist || !*sindex ){
      fprintf(stderr,"** NCS: failed to alloc %d ints for sorting\n",nbricks);
      if(*slist)  free(*slist);   /* maybe one succeeded */
      if(*sindex) free(*sindex);
      return -1;
   }

   /* init the lists */
   memcpy(*slist, blist, nbricks*sizeof(int));
   for( c1 = 0; c1 < nbricks; c1++ ) (*sindex)[c1] = c1;

   /* now actually sort slist */
   stmp = *slist;
   itmp = *sindex;
   for( c1 = 0; c1 < nbricks-1; c1++ ) {
      /* find smallest value, init to current */
      spos = c1;
      for( c2 = c1+1; c2 < nbricks; c2++ )
         if( stmp[c2] < stmp[spos] ) spos = c2;
      if( spos != c1 ) /* swap: fine, don't maintain sub-order, see if I care */
      {
         tmp        = stmp[c1];      /* first swap the sorting values */
         stmp[c1]   = stmp[spos];
         stmp[spos] = tmp;

         tmp        = itmp[c1];      /* then swap the index values */
         itmp[c1]   = itmp[spos];
         itmp[spos] = tmp;
      }
   }

   if( g_opts.debug > 2 ){
      fprintf(stderr,  "+d sorted indexing list:\n");
      fprintf(stderr,  "  orig   : ");
      for( c1 = 0; c1 < nbricks; c1++ ) fprintf(stderr,"  %d",blist[c1]);
      fprintf(stderr,"\n  new    : ");
      for( c1 = 0; c1 < nbricks; c1++ ) fprintf(stderr,"  %d",stmp[c1]);
      fprintf(stderr,"\n  indices: ");
      for( c1 = 0; c1 < nbricks; c1++ ) fprintf(stderr,"  %d",itmp[c1]);
      fputc('\n', stderr);
   }

   /* check the sort (why not?  I've got time...) */
   for( c1 = 0; c1 < nbricks-1; c1++ ){
       if( (stmp[c1] > stmp[c1+1]) || (blist[itmp[c1]] != stmp[c1]) ){
          fprintf(stderr,"** sorting screw-up, way to go, rick!\n");
          free(stmp); free(itmp); *slist = NULL; *sindex = NULL;
          return -1;
       }
   }

   if( g_opts.debug > 2 ) fprintf(stderr,"-d sorting is okay\n");

   return 0;
}